

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,string cond,Type type,string m_key_name,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> inner)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  string cond_00;
  string m_key_name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  bool in_DL;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff60 [24];
  string in_stack_ffffffffffffff78;
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_register_00000034,type));
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,in_RCX);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff68,in_R8);
  uVar2 = *in_R9;
  uVar3 = in_R9[1];
  _Var1._M_p = (pointer)in_R9[2];
  *in_R9 = 0;
  in_R9[1] = 0;
  in_R9[2] = 0;
  cond_00._M_string_length = in_stack_ffffffffffffff40;
  cond_00._M_dataplus._M_p = &stack0xffffffffffffff48;
  cond_00.field_2._M_allocated_capacity = uVar2;
  cond_00.field_2._8_8_ = uVar3;
  m_key_name_00._M_string_length = in_stack_ffffffffffffff60._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff60._8_16_;
  m_key_name_00._M_dataplus._M_p = _Var1._M_p;
  RPCResult(this,cond_00,(Type)local_58,m_key_name_00,in_DL,in_stack_ffffffffffffff78,
            (vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        std::string cond,
        Type type,
        std::string m_key_name,
        std::string description,
        std::vector<RPCResult> inner = {})
        : RPCResult{std::move(cond), type, std::move(m_key_name), /*optional=*/false, std::move(description), std::move(inner)} {}